

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_10.cpp
# Opt level: O2

int main(void)

{
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"This is a test string.\nThis is second string.",&local_81);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"\n",&local_82);
  split(&local_80,&local_28,&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"\n",&local_83);
  print_vector(&local_80,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

int main()
{
	print_vector(split("This is a test string.\nThis is second string.", "\n"), "\n");
}